

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_sao.c
# Opt level: O3

void ihevc_sao_edge_offset_class2
               (UWORD8 *pu1_src,WORD32 src_strd,UWORD8 *pu1_src_left,UWORD8 *pu1_src_top,
               UWORD8 *pu1_src_top_left,UWORD8 *pu1_src_top_right,UWORD8 *pu1_src_bot_left,
               UWORD8 *pu1_avail,WORD8 *pi1_sao_offset,WORD32 wd,WORD32 ht)

{
  UWORD8 UVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  UWORD8 *pUVar7;
  UWORD8 *pUVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  UWORD8 *pUVar12;
  ulong uVar13;
  UWORD8 UVar14;
  long lVar15;
  byte *pbVar16;
  uint uVar17;
  UWORD8 UVar18;
  UWORD8 au1_mask [64];
  WORD8 au1_sign_up [65];
  UWORD8 au1_src_top_tmp [64];
  UWORD8 au1_src_left_tmp [64];
  WORD8 au1_sign_up_tmp [65];
  UWORD8 *local_1b8;
  byte bStack_189;
  uint local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined4 uStack_170;
  undefined4 uStack_16c;
  undefined4 local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined4 local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  UWORD8 local_148 [280];
  
  local_188 = 0xffffffff;
  uStack_184 = 0xffffffff;
  uStack_180 = 0xffffffff;
  uStack_17c = 0xffffffff;
  local_178 = 0xffffffff;
  uStack_174 = 0xffffffff;
  uStack_170 = 0xffffffff;
  uStack_16c = 0xffffffff;
  local_168 = 0xffffffff;
  uStack_164 = 0xffffffff;
  uStack_160 = 0xffffffff;
  uStack_15c = 0xffffffff;
  local_158 = 0xffffffff;
  uStack_154 = 0xffffffff;
  uStack_150 = 0xffffffff;
  uStack_14c = 0xffffffff;
  lVar11 = (long)src_strd;
  if (0 < ht) {
    pUVar8 = pu1_src + (long)wd + -1;
    uVar10 = 0;
    do {
      local_148[uVar10 + 0x90] = *pUVar8;
      uVar10 = uVar10 + 1;
      pUVar8 = pUVar8 + lVar11;
    } while ((uint)ht != uVar10);
  }
  UVar1 = pu1_src_top[(long)wd + -1];
  if (0 < wd) {
    memcpy(local_148 + 0x50,pu1_src + (ht + -1) * src_strd,(ulong)(uint)wd);
  }
  bVar2 = *pu1_src;
  uVar17 = (uint)bVar2;
  if (pu1_avail[4] != '\0') {
    uVar3 = 1;
    if (*pu1_src_top_left <= bVar2) {
      uVar3 = bVar2 == *pu1_src_top_left ^ 3;
    }
    uVar5 = 0xffffffff;
    if (pu1_src[lVar11 + 1] <= bVar2) {
      uVar5 = (uint)(bVar2 != pu1_src[lVar11 + 1]);
    }
    if (uVar5 + uVar3 != 2) {
      uVar3 = (int)pi1_sao_offset[gi4_ihevc_table_edge_idx[uVar5 + uVar3]] + (uint)bVar2;
      uVar17 = 0xff;
      if (((int)uVar3 < 0x100) && (uVar17 = 0, 0 < (int)uVar3)) {
        uVar17 = uVar3;
      }
    }
  }
  iVar4 = ht + -1;
  iVar9 = iVar4 * src_strd + wd + -1;
  bVar2 = pu1_src[iVar9];
  uVar3 = (uint)bVar2;
  if (pu1_avail[7] != '\0') {
    uVar5 = 1;
    if (pu1_src[iVar9 + ~src_strd] <= bVar2) {
      uVar5 = bVar2 == pu1_src[iVar9 + ~src_strd] ^ 3;
    }
    uVar6 = 0xffffffff;
    if (pu1_src[iVar4 * src_strd + wd + src_strd] <= bVar2) {
      uVar6 = (uint)(bVar2 != pu1_src[iVar4 * src_strd + wd + src_strd]);
    }
    if (uVar6 + uVar5 != 2) {
      uVar5 = (int)pi1_sao_offset[gi4_ihevc_table_edge_idx[uVar6 + uVar5]] + (uint)bVar2;
      uVar3 = 0xff;
      if (((int)uVar5 < 0x100) && (uVar3 = 0, 0 < (int)uVar5)) {
        uVar3 = uVar5;
      }
    }
  }
  if (*pu1_avail == '\0') {
    local_188 = local_188 & 0xffffff00;
  }
  UVar18 = pu1_avail[2];
  if (UVar18 == '\0') {
    pbVar16 = pu1_src + lVar11;
    local_1b8 = pu1_src_left + 1;
    ht = iVar4;
    if (1 < wd) {
      lVar15 = 0;
      do {
        UVar14 = pu1_src[lVar15 + lVar11 + 1] != pbVar16[(int)lVar15 - src_strd];
        if (pu1_src[lVar15 + lVar11 + 1] < pbVar16[(int)lVar15 - src_strd]) {
          UVar14 = 0xff;
        }
        local_148[lVar15 + 1] = UVar14;
        lVar15 = lVar15 + 1;
      } while ((ulong)(uint)wd - 1 != lVar15);
    }
  }
  else {
    pbVar16 = pu1_src;
    local_1b8 = pu1_src_left;
    if (1 < wd) {
      uVar10 = 1;
      do {
        UVar14 = pu1_src[uVar10] != pu1_src_top[uVar10 - 1];
        if (pu1_src[uVar10] < pu1_src_top[uVar10 - 1]) {
          UVar14 = 0xff;
        }
        local_148[uVar10] = UVar14;
        uVar10 = uVar10 + 1;
      } while ((uint)wd != uVar10);
    }
  }
  if (pu1_avail[1] == '\0') {
    (&bStack_189)[wd] = 0;
  }
  uVar5 = ht - (uint)(pu1_avail[3] == '\0');
  if (0 < (int)uVar5) {
    uVar10 = 0;
    pUVar8 = local_148 + 0xd0;
    pUVar12 = local_148;
    do {
      pUVar7 = pUVar8;
      UVar18 = *pbVar16 != local_1b8[uVar10 - 1];
      if (*pbVar16 < local_1b8[uVar10 - 1]) {
        UVar18 = 0xff;
      }
      *pUVar12 = UVar18;
      if (0 < wd) {
        uVar13 = 0;
        do {
          uVar6 = (uint)(pbVar16[uVar13] != pbVar16[uVar13 + lVar11 + 1]);
          if (pbVar16[uVar13] < pbVar16[uVar13 + lVar11 + 1]) {
            uVar6 = 0xffffffff;
          }
          UVar18 = pUVar12[uVar13];
          pUVar7[uVar13 + 1] = -(char)uVar6;
          uVar6 = (uint)*(byte *)((long)&local_188 + uVar13) &
                  gi4_ihevc_table_edge_idx[(long)(char)UVar18 + (long)(int)uVar6 + 2];
          if (uVar6 != 0) {
            iVar4 = (int)pi1_sao_offset[uVar6] + (uint)pbVar16[uVar13];
            if (iVar4 < 1) {
              iVar4 = 0;
            }
            if (0xfe < iVar4) {
              iVar4 = 0xff;
            }
            pbVar16[uVar13] = (byte)iVar4;
          }
          uVar13 = uVar13 + 1;
        } while ((uint)wd != uVar13);
      }
      pbVar16 = pbVar16 + lVar11;
      uVar10 = uVar10 + 1;
      pUVar8 = pUVar12;
      pUVar12 = pUVar7;
    } while (uVar10 != uVar5);
    UVar18 = pu1_avail[2];
  }
  uVar6 = uVar5;
  if (UVar18 == '\0') {
    uVar6 = uVar5 + 1;
  }
  pbVar16[(int)-(uVar6 * src_strd)] = (byte)uVar17;
  iVar4 = 0;
  if (pu1_avail[3] != '\0') {
    iVar4 = src_strd;
  }
  pbVar16[(wd + -1) - iVar4] = (byte)uVar3;
  if (pu1_avail[2] == '\0') {
    uVar5 = uVar5 + 1;
  }
  uVar5 = uVar5 + (pu1_avail[3] == '\0');
  *pu1_src_top_left = UVar1;
  if (0 < (int)uVar5) {
    memcpy(pu1_src_left,local_148 + 0x90,(ulong)uVar5);
  }
  if (0 < wd) {
    memcpy(pu1_src_top,local_148 + 0x50,(ulong)(uint)wd);
  }
  return;
}

Assistant:

void ihevc_sao_edge_offset_class2(UWORD8 *pu1_src,
                                  WORD32 src_strd,
                                  UWORD8 *pu1_src_left,
                                  UWORD8 *pu1_src_top,
                                  UWORD8 *pu1_src_top_left,
                                  UWORD8 *pu1_src_top_right,
                                  UWORD8 *pu1_src_bot_left,
                                  UWORD8 *pu1_avail,
                                  WORD8 *pi1_sao_offset,
                                  WORD32 wd,
                                  WORD32 ht)
{
    WORD32 row, col;
    UWORD8 au1_mask[MAX_CTB_SIZE];
    UWORD8 au1_src_left_tmp[MAX_CTB_SIZE], au1_src_top_tmp[MAX_CTB_SIZE];
    UWORD8 u1_src_top_left_tmp;
    WORD8 au1_sign_up[MAX_CTB_SIZE + 1], au1_sign_up_tmp[MAX_CTB_SIZE + 1];
    WORD8 u1_sign_down;
    WORD8 *pu1_sign_up;
    WORD8 *pu1_sign_up_tmp;
    UWORD8 *pu1_src_left_cpy;

    WORD32 bit_depth;
    UWORD8 u1_pos_0_0_tmp;
    UWORD8 u1_pos_wd_ht_tmp;
    UNUSED(pu1_src_top_right);
    UNUSED(pu1_src_bot_left);

    bit_depth = BIT_DEPTH_LUMA;
    pu1_sign_up = au1_sign_up;
    pu1_sign_up_tmp = au1_sign_up_tmp;
    pu1_src_left_cpy = pu1_src_left;

    /* Initialize the mask values */
    memset(au1_mask, 0xFF, MAX_CTB_SIZE);

    /* Update left, top and top-left arrays */
    u1_src_top_left_tmp = pu1_src_top[wd - 1];
    for(row = 0; row < ht; row++)
    {
        au1_src_left_tmp[row] = pu1_src[row * src_strd + wd - 1];
    }
    for(col = 0; col < wd; col++)
    {
        au1_src_top_tmp[col] = pu1_src[(ht - 1) * src_strd + col];
    }


    /* If top-left is available, process separately */
    if(0 != pu1_avail[4])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[0] - pu1_src_top_left[0]) +
                        SIGN(pu1_src[0] - pu1_src[1 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_0_0_tmp = CLIP3(pu1_src[0] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_0_0_tmp = pu1_src[0];
        }
    }
    else
    {
        u1_pos_0_0_tmp = pu1_src[0];
    }

    /* If bottom-right is available, process separately */
    if(0 != pu1_avail[7])
    {
        WORD32 edge_idx;

        edge_idx = 2 + SIGN(pu1_src[wd - 1 + (ht - 1) * src_strd] - pu1_src[wd - 1 + (ht - 1) * src_strd - 1 - src_strd]) +
                        SIGN(pu1_src[wd - 1 + (ht - 1) * src_strd] - pu1_src[wd - 1 + (ht - 1) * src_strd + 1 + src_strd]);

        edge_idx = gi4_ihevc_table_edge_idx[edge_idx];

        if(0 != edge_idx)
        {
            u1_pos_wd_ht_tmp = CLIP3(pu1_src[wd - 1 + (ht - 1) * src_strd] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
        }
        else
        {
            u1_pos_wd_ht_tmp = pu1_src[wd - 1 + (ht - 1) * src_strd];
        }
    }
    else
    {
        u1_pos_wd_ht_tmp = pu1_src[wd - 1 + (ht - 1) * src_strd];
    }

    /* If Left is not available */
    if(0 == pu1_avail[0])
    {
        au1_mask[0] = 0;
    }

    /* If Top is not available */
    if(0 == pu1_avail[2])
    {
        pu1_src += src_strd;
        ht--;
        pu1_src_left_cpy += 1;
        for(col = 1; col < wd; col++)
        {
            pu1_sign_up[col] = SIGN(pu1_src[col] - pu1_src[col - 1 - src_strd]);
        }
    }
    else
    {
        for(col = 1; col < wd; col++)
        {
            pu1_sign_up[col] = SIGN(pu1_src[col] - pu1_src_top[col - 1]);
        }
    }

    /* If Right is not available */
    if(0 == pu1_avail[1])
    {
        au1_mask[wd - 1] = 0;
    }

    /* If Bottom is not available */
    if(0 == pu1_avail[3])
    {
        ht--;
    }

    /* Processing is done on the intermediate buffer and the output is written to the source buffer */
    {
        for(row = 0; row < ht; row++)
        {
            pu1_sign_up[0] = SIGN(pu1_src[0] - pu1_src_left_cpy[row - 1]);
            for(col = 0; col < wd; col++)
            {
                WORD32 edge_idx;

                u1_sign_down = SIGN(pu1_src[col] - pu1_src[col + 1 + src_strd]);
                edge_idx = 2 + pu1_sign_up[col] + u1_sign_down;
                pu1_sign_up_tmp[col + 1] = -u1_sign_down;

                edge_idx = gi4_ihevc_table_edge_idx[edge_idx] & au1_mask[col];

                if(0 != edge_idx)
                {
                    pu1_src[col] = CLIP3(pu1_src[col] + pi1_sao_offset[edge_idx], 0, (1 << bit_depth) - 1);
                }
            }

            /* Swapping pu1_sign_up_tmp and pu1_sign_up */
            {
                WORD8 *pu1_swap_tmp = pu1_sign_up;
                pu1_sign_up = pu1_sign_up_tmp;
                pu1_sign_up_tmp = pu1_swap_tmp;
            }

            pu1_src += src_strd;
        }

        pu1_src[-(pu1_avail[2] ? ht : ht + 1) * src_strd] = u1_pos_0_0_tmp;
        pu1_src[(pu1_avail[3] ? wd - 1 - src_strd : wd - 1)] = u1_pos_wd_ht_tmp;
    }

    if(0 == pu1_avail[2])
        ht++;
    if(0 == pu1_avail[3])
        ht++;
    *pu1_src_top_left = u1_src_top_left_tmp;
    for(row = 0; row < ht; row++)
    {
        pu1_src_left[row] = au1_src_left_tmp[row];
    }
    for(col = 0; col < wd; col++)
    {
        pu1_src_top[col] = au1_src_top_tmp[col];
    }

}